

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAXUserParseFile(void)

{
  int iVar1;
  int iVar2;
  xmlSAXHandlerPtr val;
  char *val_00;
  xmlSAXHandlerPtr pxVar3;
  int local_44;
  int n_filename;
  char *filename;
  void *pvStack_30;
  int n_user_data;
  void *user_data;
  int n_sax;
  xmlSAXHandlerPtr sax;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (user_data._4_4_ = 0; (int)user_data._4_4_ < 2; user_data._4_4_ = user_data._4_4_ + 1) {
    for (filename._4_4_ = 0; (int)filename._4_4_ < 3; filename._4_4_ = filename._4_4_ + 1) {
      for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlSAXHandlerPtr(user_data._4_4_,0);
        pvStack_30 = gen_userdata(filename._4_4_,1);
        val_00 = gen_filepath(local_44,2);
        pxVar3 = (xmlSAXHandlerPtr)__xmlDefaultSAXHandler();
        if (val == pxVar3) {
          pvStack_30 = (void *)0x0;
        }
        iVar2 = xmlSAXUserParseFile(val,pvStack_30,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlSAXHandlerPtr(user_data._4_4_,val,0);
        des_userdata(filename._4_4_,pvStack_30,1);
        des_filepath(local_44,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXUserParseFile",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)user_data._4_4_);
          printf(" %d",(ulong)filename._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSAXUserParseFile(void) {
    int test_ret = 0;

#if defined(LIBXML_SAX1_ENABLED)
#ifdef LIBXML_SAX1_ENABLED
    int mem_base;
    int ret_val;
    xmlSAXHandlerPtr sax; /* a SAX handler */
    int n_sax;
    void * user_data; /* The user data returned on SAX callbacks */
    int n_user_data;
    const char * filename; /* a file name */
    int n_filename;

    for (n_sax = 0;n_sax < gen_nb_xmlSAXHandlerPtr;n_sax++) {
    for (n_user_data = 0;n_user_data < gen_nb_userdata;n_user_data++) {
    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
        mem_base = xmlMemBlocks();
        sax = gen_xmlSAXHandlerPtr(n_sax, 0);
        user_data = gen_userdata(n_user_data, 1);
        filename = gen_filepath(n_filename, 2);
        
#ifdef LIBXML_SAX1_ENABLED
        if (sax == (xmlSAXHandlerPtr)&xmlDefaultSAXHandler) user_data = NULL;
#endif


        ret_val = xmlSAXUserParseFile(sax, user_data, filename);
        desret_int(ret_val);
        call_tests++;
        des_xmlSAXHandlerPtr(n_sax, sax, 0);
        des_userdata(n_user_data, user_data, 1);
        des_filepath(n_filename, filename, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAXUserParseFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_sax);
            printf(" %d", n_user_data);
            printf(" %d", n_filename);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}